

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpf_common_sse2.h
# Opt level: O0

void transpose_16x8_to_8x16(uchar *src,int in_p,uchar *dst,int out_p)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 *puVar21;
  int in_ECX;
  undefined8 *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  __m128i x_s27;
  __m128i x_s26;
  __m128i x_s25;
  __m128i x_s24;
  __m128i x_s23;
  __m128i x_s22;
  __m128i x_s21;
  __m128i x_s20;
  __m128i x_s17;
  __m128i x_s16;
  __m128i x_s15;
  __m128i x_s14;
  __m128i x_s13;
  __m128i x_s12;
  __m128i x_s11;
  __m128i x_s10;
  __m128i x7;
  __m128i x6;
  __m128i x5;
  __m128i x4;
  __m128i x3;
  __m128i x2;
  __m128i x1;
  __m128i x0;
  undefined8 uStack_560;
  undefined8 uStack_540;
  undefined8 uStack_520;
  undefined8 uStack_500;
  undefined1 local_2c8;
  undefined1 uStack_2c7;
  undefined1 uStack_2c6;
  undefined1 uStack_2c5;
  undefined1 uStack_2c4;
  undefined1 uStack_2c3;
  undefined1 uStack_2c2;
  undefined1 uStack_2c1;
  undefined1 local_2b8;
  undefined1 uStack_2b7;
  undefined1 uStack_2b6;
  undefined1 uStack_2b5;
  undefined1 uStack_2b4;
  undefined1 uStack_2b3;
  undefined1 uStack_2b2;
  undefined1 uStack_2b1;
  undefined1 local_2a8;
  undefined1 uStack_2a7;
  undefined1 uStack_2a6;
  undefined1 uStack_2a5;
  undefined1 uStack_2a4;
  undefined1 uStack_2a3;
  undefined1 uStack_2a2;
  undefined1 uStack_2a1;
  undefined1 local_298;
  undefined1 uStack_297;
  undefined1 uStack_296;
  undefined1 uStack_295;
  undefined1 uStack_294;
  undefined1 uStack_293;
  undefined1 uStack_292;
  undefined1 uStack_291;
  undefined1 local_288;
  undefined1 uStack_287;
  undefined1 uStack_286;
  undefined1 uStack_285;
  undefined1 uStack_284;
  undefined1 uStack_283;
  undefined1 uStack_282;
  undefined1 uStack_281;
  undefined1 local_278;
  undefined1 uStack_277;
  undefined1 uStack_276;
  undefined1 uStack_275;
  undefined1 uStack_274;
  undefined1 uStack_273;
  undefined1 uStack_272;
  undefined1 uStack_271;
  undefined1 local_268;
  undefined1 uStack_267;
  undefined1 uStack_266;
  undefined1 uStack_265;
  undefined1 uStack_264;
  undefined1 uStack_263;
  undefined1 uStack_262;
  undefined1 uStack_261;
  undefined1 local_258;
  undefined1 uStack_257;
  undefined1 uStack_256;
  undefined1 uStack_255;
  undefined1 uStack_254;
  undefined1 uStack_253;
  undefined1 uStack_252;
  undefined1 uStack_251;
  undefined1 uStack_200;
  undefined1 uStack_1ff;
  undefined1 uStack_1fe;
  undefined1 uStack_1fd;
  undefined1 uStack_1fc;
  undefined1 uStack_1fb;
  undefined1 uStack_1fa;
  undefined1 uStack_1f9;
  undefined1 uStack_1f0;
  undefined1 uStack_1ef;
  undefined1 uStack_1ee;
  undefined1 uStack_1ed;
  undefined1 uStack_1ec;
  undefined1 uStack_1eb;
  undefined1 uStack_1ea;
  undefined1 uStack_1e9;
  undefined1 uStack_1e0;
  undefined1 uStack_1df;
  undefined1 uStack_1de;
  undefined1 uStack_1dd;
  undefined1 uStack_1dc;
  undefined1 uStack_1db;
  undefined1 uStack_1da;
  undefined1 uStack_1d9;
  undefined1 uStack_1d0;
  undefined1 uStack_1cf;
  undefined1 uStack_1ce;
  undefined1 uStack_1cd;
  undefined1 uStack_1cc;
  undefined1 uStack_1cb;
  undefined1 uStack_1ca;
  undefined1 uStack_1c9;
  undefined1 uStack_1c0;
  undefined1 uStack_1bf;
  undefined1 uStack_1be;
  undefined1 uStack_1bd;
  undefined1 uStack_1bc;
  undefined1 uStack_1bb;
  undefined1 uStack_1ba;
  undefined1 uStack_1b9;
  undefined1 uStack_1b0;
  undefined1 uStack_1af;
  undefined1 uStack_1ae;
  undefined1 uStack_1ad;
  undefined1 uStack_1ac;
  undefined1 uStack_1ab;
  undefined1 uStack_1aa;
  undefined1 uStack_1a9;
  undefined1 uStack_1a0;
  undefined1 uStack_19f;
  undefined1 uStack_19e;
  undefined1 uStack_19d;
  undefined1 uStack_19c;
  undefined1 uStack_19b;
  undefined1 uStack_19a;
  undefined1 uStack_199;
  undefined1 uStack_190;
  undefined1 uStack_18f;
  undefined1 uStack_18e;
  undefined1 uStack_18d;
  undefined1 uStack_18c;
  undefined1 uStack_18b;
  undefined1 uStack_18a;
  undefined1 uStack_189;
  __m128i x_s37;
  __m128i x_s36;
  __m128i x_s35;
  __m128i x_s34;
  __m128i x_s33;
  __m128i x_s32;
  __m128i x_s31;
  __m128i x_s30;
  
  uVar2 = *in_RDI;
  uVar4 = in_RDI[1];
  uVar6 = *(undefined8 *)((long)in_RDI + (long)in_ESI);
  uVar8 = ((undefined8 *)((long)in_RDI + (long)in_ESI))[1];
  puVar21 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 2));
  uVar9 = *puVar21;
  uVar10 = puVar21[1];
  puVar21 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 3));
  uVar11 = *puVar21;
  uVar12 = puVar21[1];
  puVar21 = (undefined8 *)((long)in_RDI + (long)(in_ESI << 2));
  uVar13 = *puVar21;
  uVar14 = puVar21[1];
  puVar21 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 5));
  uVar15 = *puVar21;
  uVar16 = puVar21[1];
  puVar21 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 6));
  uVar17 = *puVar21;
  uVar18 = puVar21[1];
  puVar21 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 7));
  uVar19 = *puVar21;
  uVar20 = puVar21[1];
  local_258 = (undefined1)uVar2;
  uStack_257 = (undefined1)((ulong)uVar2 >> 8);
  uStack_256 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_255 = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_254 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_253 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_252 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_251 = (undefined1)((ulong)uVar2 >> 0x38);
  local_268 = (undefined1)uVar6;
  uStack_267 = (undefined1)((ulong)uVar6 >> 8);
  uStack_266 = (undefined1)((ulong)uVar6 >> 0x10);
  uStack_265 = (undefined1)((ulong)uVar6 >> 0x18);
  uStack_264 = (undefined1)((ulong)uVar6 >> 0x20);
  uStack_263 = (undefined1)((ulong)uVar6 >> 0x28);
  uStack_262 = (undefined1)((ulong)uVar6 >> 0x30);
  uStack_261 = (undefined1)((ulong)uVar6 >> 0x38);
  uStack_190 = (undefined1)uVar4;
  uStack_18f = (undefined1)((ulong)uVar4 >> 8);
  uStack_18e = (undefined1)((ulong)uVar4 >> 0x10);
  uStack_18d = (undefined1)((ulong)uVar4 >> 0x18);
  uStack_18c = (undefined1)((ulong)uVar4 >> 0x20);
  uStack_18b = (undefined1)((ulong)uVar4 >> 0x28);
  uStack_18a = (undefined1)((ulong)uVar4 >> 0x30);
  uStack_189 = (undefined1)((ulong)uVar4 >> 0x38);
  uStack_1a0 = (undefined1)uVar8;
  uStack_19f = (undefined1)((ulong)uVar8 >> 8);
  uStack_19e = (undefined1)((ulong)uVar8 >> 0x10);
  uStack_19d = (undefined1)((ulong)uVar8 >> 0x18);
  uStack_19c = (undefined1)((ulong)uVar8 >> 0x20);
  uStack_19b = (undefined1)((ulong)uVar8 >> 0x28);
  uStack_19a = (undefined1)((ulong)uVar8 >> 0x30);
  uStack_199 = (undefined1)((ulong)uVar8 >> 0x38);
  local_278 = (undefined1)uVar9;
  uStack_277 = (undefined1)((ulong)uVar9 >> 8);
  uStack_276 = (undefined1)((ulong)uVar9 >> 0x10);
  uStack_275 = (undefined1)((ulong)uVar9 >> 0x18);
  uStack_274 = (undefined1)((ulong)uVar9 >> 0x20);
  uStack_273 = (undefined1)((ulong)uVar9 >> 0x28);
  uStack_272 = (undefined1)((ulong)uVar9 >> 0x30);
  uStack_271 = (undefined1)((ulong)uVar9 >> 0x38);
  local_288 = (undefined1)uVar11;
  uStack_287 = (undefined1)((ulong)uVar11 >> 8);
  uStack_286 = (undefined1)((ulong)uVar11 >> 0x10);
  uStack_285 = (undefined1)((ulong)uVar11 >> 0x18);
  uStack_284 = (undefined1)((ulong)uVar11 >> 0x20);
  uStack_283 = (undefined1)((ulong)uVar11 >> 0x28);
  uStack_282 = (undefined1)((ulong)uVar11 >> 0x30);
  uStack_281 = (undefined1)((ulong)uVar11 >> 0x38);
  uStack_1b0 = (undefined1)uVar10;
  uStack_1af = (undefined1)((ulong)uVar10 >> 8);
  uStack_1ae = (undefined1)((ulong)uVar10 >> 0x10);
  uStack_1ad = (undefined1)((ulong)uVar10 >> 0x18);
  uStack_1ac = (undefined1)((ulong)uVar10 >> 0x20);
  uStack_1ab = (undefined1)((ulong)uVar10 >> 0x28);
  uStack_1aa = (undefined1)((ulong)uVar10 >> 0x30);
  uStack_1a9 = (undefined1)((ulong)uVar10 >> 0x38);
  uStack_1c0 = (undefined1)uVar12;
  uStack_1bf = (undefined1)((ulong)uVar12 >> 8);
  uStack_1be = (undefined1)((ulong)uVar12 >> 0x10);
  uStack_1bd = (undefined1)((ulong)uVar12 >> 0x18);
  uStack_1bc = (undefined1)((ulong)uVar12 >> 0x20);
  uStack_1bb = (undefined1)((ulong)uVar12 >> 0x28);
  uStack_1ba = (undefined1)((ulong)uVar12 >> 0x30);
  uStack_1b9 = (undefined1)((ulong)uVar12 >> 0x38);
  local_298 = (undefined1)uVar13;
  uStack_297 = (undefined1)((ulong)uVar13 >> 8);
  uStack_296 = (undefined1)((ulong)uVar13 >> 0x10);
  uStack_295 = (undefined1)((ulong)uVar13 >> 0x18);
  uStack_294 = (undefined1)((ulong)uVar13 >> 0x20);
  uStack_293 = (undefined1)((ulong)uVar13 >> 0x28);
  uStack_292 = (undefined1)((ulong)uVar13 >> 0x30);
  uStack_291 = (undefined1)((ulong)uVar13 >> 0x38);
  local_2a8 = (undefined1)uVar15;
  uStack_2a7 = (undefined1)((ulong)uVar15 >> 8);
  uStack_2a6 = (undefined1)((ulong)uVar15 >> 0x10);
  uStack_2a5 = (undefined1)((ulong)uVar15 >> 0x18);
  uStack_2a4 = (undefined1)((ulong)uVar15 >> 0x20);
  uStack_2a3 = (undefined1)((ulong)uVar15 >> 0x28);
  uStack_2a2 = (undefined1)((ulong)uVar15 >> 0x30);
  uStack_2a1 = (undefined1)((ulong)uVar15 >> 0x38);
  uStack_1d0 = (undefined1)uVar14;
  uStack_1cf = (undefined1)((ulong)uVar14 >> 8);
  uStack_1ce = (undefined1)((ulong)uVar14 >> 0x10);
  uStack_1cd = (undefined1)((ulong)uVar14 >> 0x18);
  uStack_1cc = (undefined1)((ulong)uVar14 >> 0x20);
  uStack_1cb = (undefined1)((ulong)uVar14 >> 0x28);
  uStack_1ca = (undefined1)((ulong)uVar14 >> 0x30);
  uStack_1c9 = (undefined1)((ulong)uVar14 >> 0x38);
  uStack_1e0 = (undefined1)uVar16;
  uStack_1df = (undefined1)((ulong)uVar16 >> 8);
  uStack_1de = (undefined1)((ulong)uVar16 >> 0x10);
  uStack_1dd = (undefined1)((ulong)uVar16 >> 0x18);
  uStack_1dc = (undefined1)((ulong)uVar16 >> 0x20);
  uStack_1db = (undefined1)((ulong)uVar16 >> 0x28);
  uStack_1da = (undefined1)((ulong)uVar16 >> 0x30);
  uStack_1d9 = (undefined1)((ulong)uVar16 >> 0x38);
  local_2b8 = (undefined1)uVar17;
  uStack_2b7 = (undefined1)((ulong)uVar17 >> 8);
  uStack_2b6 = (undefined1)((ulong)uVar17 >> 0x10);
  uStack_2b5 = (undefined1)((ulong)uVar17 >> 0x18);
  uStack_2b4 = (undefined1)((ulong)uVar17 >> 0x20);
  uStack_2b3 = (undefined1)((ulong)uVar17 >> 0x28);
  uStack_2b2 = (undefined1)((ulong)uVar17 >> 0x30);
  uStack_2b1 = (undefined1)((ulong)uVar17 >> 0x38);
  local_2c8 = (undefined1)uVar19;
  uStack_2c7 = (undefined1)((ulong)uVar19 >> 8);
  uStack_2c6 = (undefined1)((ulong)uVar19 >> 0x10);
  uStack_2c5 = (undefined1)((ulong)uVar19 >> 0x18);
  uStack_2c4 = (undefined1)((ulong)uVar19 >> 0x20);
  uStack_2c3 = (undefined1)((ulong)uVar19 >> 0x28);
  uStack_2c2 = (undefined1)((ulong)uVar19 >> 0x30);
  uStack_2c1 = (undefined1)((ulong)uVar19 >> 0x38);
  uStack_1f0 = (undefined1)uVar18;
  uStack_1ef = (undefined1)((ulong)uVar18 >> 8);
  uStack_1ee = (undefined1)((ulong)uVar18 >> 0x10);
  uStack_1ed = (undefined1)((ulong)uVar18 >> 0x18);
  uStack_1ec = (undefined1)((ulong)uVar18 >> 0x20);
  uStack_1eb = (undefined1)((ulong)uVar18 >> 0x28);
  uStack_1ea = (undefined1)((ulong)uVar18 >> 0x30);
  uStack_1e9 = (undefined1)((ulong)uVar18 >> 0x38);
  uStack_200 = (undefined1)uVar20;
  uStack_1ff = (undefined1)((ulong)uVar20 >> 8);
  uStack_1fe = (undefined1)((ulong)uVar20 >> 0x10);
  uStack_1fd = (undefined1)((ulong)uVar20 >> 0x18);
  uStack_1fc = (undefined1)((ulong)uVar20 >> 0x20);
  uStack_1fb = (undefined1)((ulong)uVar20 >> 0x28);
  uStack_1fa = (undefined1)((ulong)uVar20 >> 0x30);
  uStack_1f9 = (undefined1)((ulong)uVar20 >> 0x38);
  uVar2 = CONCAT17(uStack_2c6,
                   CONCAT16(uStack_2b6,
                            CONCAT15(uStack_2a6,
                                     CONCAT14(uStack_296,
                                              CONCAT13(uStack_286,
                                                       CONCAT12(uStack_276,
                                                                CONCAT11(uStack_266,uStack_256))))))
                  );
  auVar1[8] = uStack_255;
  auVar1._0_8_ = uVar2;
  auVar1[9] = uStack_265;
  auVar1[10] = uStack_275;
  auVar1[0xb] = uStack_285;
  auVar1[0xc] = uStack_295;
  auVar1[0xd] = uStack_2a5;
  auVar1[0xe] = uStack_2b5;
  auVar1[0xf] = uStack_2c5;
  uVar4 = CONCAT17(uStack_2c2,
                   CONCAT16(uStack_2b2,
                            CONCAT15(uStack_2a2,
                                     CONCAT14(uStack_292,
                                              (int)(CONCAT14(uStack_282,
                                                             CONCAT13(uStack_272,
                                                                      CONCAT12(uStack_262,
                                                                               CONCAT11(uStack_252,
                                                                                        uStack_283))
                                                                     )) >> 8)))));
  auVar3[8] = uStack_251;
  auVar3._0_8_ = uVar4;
  auVar3[9] = uStack_261;
  auVar3[10] = uStack_271;
  auVar3[0xb] = uStack_281;
  auVar3[0xc] = uStack_291;
  auVar3[0xd] = uStack_2a1;
  auVar3[0xe] = uStack_2b1;
  auVar3[0xf] = uStack_2c1;
  uVar6 = CONCAT17(uStack_1fe,
                   CONCAT16(uStack_1ee,
                            CONCAT15(uStack_1de,
                                     CONCAT14(uStack_1ce,
                                              CONCAT13(uStack_1be,
                                                       CONCAT12(uStack_1ae,
                                                                CONCAT11(uStack_19e,uStack_18e))))))
                  );
  auVar5[8] = uStack_18d;
  auVar5._0_8_ = uVar6;
  auVar5[9] = uStack_19d;
  auVar5[10] = uStack_1ad;
  auVar5[0xb] = uStack_1bd;
  auVar5[0xc] = uStack_1cd;
  auVar5[0xd] = uStack_1dd;
  auVar5[0xe] = uStack_1ed;
  auVar5[0xf] = uStack_1fd;
  uVar8 = CONCAT17(uStack_1fa,
                   CONCAT16(uStack_1ea,
                            CONCAT15(uStack_1da,
                                     CONCAT14(uStack_1ca,
                                              (int)(CONCAT14(uStack_1ba,
                                                             CONCAT13(uStack_1aa,
                                                                      CONCAT12(uStack_19a,
                                                                               CONCAT11(uStack_18a,
                                                                                        uStack_1bb))
                                                                     )) >> 8)))));
  auVar7[8] = uStack_189;
  auVar7._0_8_ = uVar8;
  auVar7[9] = uStack_199;
  auVar7[10] = uStack_1a9;
  auVar7[0xb] = uStack_1b9;
  auVar7[0xc] = uStack_1c9;
  auVar7[0xd] = uStack_1d9;
  auVar7[0xe] = uStack_1e9;
  auVar7[0xf] = uStack_1f9;
  *in_RDX = CONCAT17(local_2c8,
                     CONCAT16(local_2b8,
                              CONCAT15(local_2a8,
                                       CONCAT14(local_298,
                                                CONCAT13(local_288,
                                                         CONCAT12(local_278,
                                                                  CONCAT11(local_268,local_258))))))
                    );
  *(ulong *)((long)in_RDX + (long)in_ECX) =
       CONCAT17(uStack_2c7,
                CONCAT16(uStack_2b7,
                         CONCAT15(uStack_2a7,
                                  CONCAT14(uStack_297,
                                           CONCAT13(uStack_287,
                                                    CONCAT12(uStack_277,
                                                             CONCAT11(uStack_267,uStack_257)))))));
  *(undefined8 *)((long)in_RDX + (long)(in_ECX << 1)) = uVar2;
  uStack_500 = auVar1._8_8_;
  *(undefined8 *)((long)in_RDX + (long)(in_ECX * 3)) = uStack_500;
  *(ulong *)((long)in_RDX + (long)(in_ECX << 2)) =
       CONCAT17(uStack_2c4,
                CONCAT16(uStack_2b4,
                         CONCAT15(uStack_2a4,
                                  CONCAT14(uStack_294,
                                           CONCAT13(uStack_284,
                                                    CONCAT12(uStack_274,
                                                             CONCAT11(uStack_264,uStack_254)))))));
  *(ulong *)((long)in_RDX + (long)(in_ECX * 5)) =
       CONCAT17(uStack_2c3,
                CONCAT16(uStack_2b3,
                         CONCAT15(uStack_2a3,
                                  CONCAT14(uStack_293,
                                           CONCAT13(uStack_283,
                                                    CONCAT12(uStack_273,
                                                             CONCAT11(uStack_263,uStack_253)))))));
  *(undefined8 *)((long)in_RDX + (long)(in_ECX * 6)) = uVar4;
  uStack_520 = auVar3._8_8_;
  *(undefined8 *)((long)in_RDX + (long)(in_ECX * 7)) = uStack_520;
  *(ulong *)((long)in_RDX + (long)(in_ECX << 3)) =
       CONCAT17(uStack_200,
                CONCAT16(uStack_1f0,
                         CONCAT15(uStack_1e0,
                                  CONCAT14(uStack_1d0,
                                           CONCAT13(uStack_1c0,
                                                    CONCAT12(uStack_1b0,
                                                             CONCAT11(uStack_1a0,uStack_190)))))));
  *(ulong *)((long)in_RDX + (long)(in_ECX * 9)) =
       CONCAT17(uStack_1ff,
                CONCAT16(uStack_1ef,
                         CONCAT15(uStack_1df,
                                  CONCAT14(uStack_1cf,
                                           CONCAT13(uStack_1bf,
                                                    CONCAT12(uStack_1af,
                                                             CONCAT11(uStack_19f,uStack_18f)))))));
  *(undefined8 *)((long)in_RDX + (long)(in_ECX * 10)) = uVar6;
  uStack_540 = auVar5._8_8_;
  *(undefined8 *)((long)in_RDX + (long)(in_ECX * 0xb)) = uStack_540;
  *(ulong *)((long)in_RDX + (long)(in_ECX * 0xc)) =
       CONCAT17(uStack_1fc,
                CONCAT16(uStack_1ec,
                         CONCAT15(uStack_1dc,
                                  CONCAT14(uStack_1cc,
                                           CONCAT13(uStack_1bc,
                                                    CONCAT12(uStack_1ac,
                                                             CONCAT11(uStack_19c,uStack_18c)))))));
  *(ulong *)((long)in_RDX + (long)(in_ECX * 0xd)) =
       CONCAT17(uStack_1fb,
                CONCAT16(uStack_1eb,
                         CONCAT15(uStack_1db,
                                  CONCAT14(uStack_1cb,
                                           CONCAT13(uStack_1bb,
                                                    CONCAT12(uStack_1ab,
                                                             CONCAT11(uStack_19b,uStack_18b)))))));
  *(undefined8 *)((long)in_RDX + (long)(in_ECX * 0xe)) = uVar8;
  uStack_560 = auVar7._8_8_;
  *(undefined8 *)((long)in_RDX + (long)(in_ECX * 0xf)) = uStack_560;
  return;
}

Assistant:

static inline void transpose_16x8_to_8x16(unsigned char *src, int in_p,
                                          unsigned char *dst, int out_p) {
  // a0 b0 c0 d0 e0 f0 g0 h0 A0 B0 C0 D0 E0 F0 G0 H0
  // a1 b1 c1 d1 e1 f1 g1 h1 A1 B1 C1 D1 E1 F1 G1 H1
  // a2 b2 c2 d2 e2 f2 g2 h2 A2 B2 C2 D2 E2 F2 G2 H2
  // a3 b3 c3 d3 e3 f3 g3 h3 A3 B3 C3 D3 E3 F3 G3 H3
  // a4 b4 c4 d4 e4 f4 g4 h4 A4 B4 C4 D4 E4 F4 G4 H4
  // a5 b5 c5 d5 e5 f5 g5 h5 A5 B5 C5 D5 E5 F5 G5 H5
  // a6 b6 c6 d6 e6 f6 g6 h6 A6 B6 C6 D6 E6 F6 G6 H6
  // a7 b7 c7 d7 e7 f7 g7 h7 A7 B7 C7 D7 E7 F7 G7 H7
  const __m128i x0 = _mm_loadu_si128((__m128i *)(src));
  const __m128i x1 = _mm_loadu_si128((__m128i *)(src + (1 * in_p)));
  const __m128i x2 = _mm_loadu_si128((__m128i *)(src + (2 * in_p)));
  const __m128i x3 = _mm_loadu_si128((__m128i *)(src + (3 * in_p)));
  const __m128i x4 = _mm_loadu_si128((__m128i *)(src + (4 * in_p)));
  const __m128i x5 = _mm_loadu_si128((__m128i *)(src + (5 * in_p)));
  const __m128i x6 = _mm_loadu_si128((__m128i *)(src + (6 * in_p)));
  const __m128i x7 = _mm_loadu_si128((__m128i *)(src + (7 * in_p)));

  // a0 a1 b0 b1 c0 c1 d0 d1 A0 A1 B0 B1 C0 C1 D0 D1
  // e0 e1 f0 f1 g0 g1 h0 h1 E0 E1 F0 F1 G0 G1 H0 H1
  // a2 a3 b2 b3 c2 c3 d2 d3 A2 A3 B2 B3 C2 C3 D2 D3
  // e2 e3 f2 f3 g2 g3 h2 h3 E2 E3 F2 F3 G2 G3 H2 H3
  // a4 a5 b4 b5 c4 c5 d4 d5 A4 A5 B4 B5 C4 C5 D4 D5
  // e4 e5 f4 f5 g4 g5 h4 h5 E4 E5 F4 F5 G4 G5 H4 H5
  // a6 a7 b6 b7 c6 c7 d6 d7 A6 A7 B6 B7 C6 C7 D6 D7
  // e6 e7 f6 f7 g6 g7 h6 h7 E6 E7 F6 F7 G6 G7 H6 H7
  const __m128i x_s10 = _mm_unpacklo_epi8(x0, x1);
  const __m128i x_s11 = _mm_unpackhi_epi8(x0, x1);
  const __m128i x_s12 = _mm_unpacklo_epi8(x2, x3);
  const __m128i x_s13 = _mm_unpackhi_epi8(x2, x3);
  const __m128i x_s14 = _mm_unpacklo_epi8(x4, x5);
  const __m128i x_s15 = _mm_unpackhi_epi8(x4, x5);
  const __m128i x_s16 = _mm_unpacklo_epi8(x6, x7);
  const __m128i x_s17 = _mm_unpackhi_epi8(x6, x7);

  // a0 a1 a2 a3 b0 b1 b2 b3 | A0 A1 A2 A3 B0 B1 B2 B3
  // c0 c1 c2 c3 d0 d1 d2 d3 | C0 C1 C2 C3 D0 D1 D2 D3
  // e0 e1 e2 e3 f0 f1 f2 f3 | E0 E1 E2 E3 F0 F1 F2 F3
  // g0 g1 g2 g3 h0 h1 h2 h3 | G0 G1 G2 G3 H0 H1 H2 H3
  // a4 a5 a6 a7 b4 b5 b6 b7 | A4 A5 A6 A7 B4 B5 B6 B7
  // c4 c5 c6 c7 d4 d5 d6 d7 | C4 C5 C6 C7 D4 D5 D6 D7
  // e4 e5 e6 e7 f4 f5 f6 f7 | E4 E5 E6 E7 F4 F5 F6 F7
  // g4 g5 g6 g7 h4 h5 h6 h7 | G4 G5 G6 G7 H4 H5 H6 H7
  const __m128i x_s20 = _mm_unpacklo_epi16(x_s10, x_s12);
  const __m128i x_s21 = _mm_unpackhi_epi16(x_s10, x_s12);
  const __m128i x_s22 = _mm_unpacklo_epi16(x_s11, x_s13);
  const __m128i x_s23 = _mm_unpackhi_epi16(x_s11, x_s13);
  const __m128i x_s24 = _mm_unpacklo_epi16(x_s14, x_s16);
  const __m128i x_s25 = _mm_unpackhi_epi16(x_s14, x_s16);
  const __m128i x_s26 = _mm_unpacklo_epi16(x_s15, x_s17);
  const __m128i x_s27 = _mm_unpackhi_epi16(x_s15, x_s17);

  // a0 a1 a2 a3 a4 a5 a6 a7 | A0 A1 A2 A3 A4 A5 A6 A7
  // b0 b1 b2 b3 b4 b5 b6 b7 | B0 B1 B2 B3 B4 B5 B6 B7
  // c0 c1 c2 c3 c4 c5 c6 c7 | C0 C1 C2 C3 C4 C5 C6 C7
  // d0 d1 d2 d3 d4 d5 d6 d7 | D0 D1 D2 D3 D4 D5 D6 D7
  // e0 e1 e2 e3 e4 e5 e6 e7 | E0 E1 E2 E3 E4 E5 E6 E7
  // f0 f1 f2 f3 f4 f5 f6 f7 | F0 F1 F2 F3 F4 F5 F6 F7
  // g0 g1 g2 g3 g4 g5 g6 g7 | G0 G1 G2 G3 G4 G5 G6 G7
  // h0 h1 h2 h3 h4 h5 h6 h7 | H0 H1 H2 H3 H4 H5 H6 H7
  const __m128i x_s30 = _mm_unpacklo_epi32(x_s20, x_s24);
  const __m128i x_s31 = _mm_unpackhi_epi32(x_s20, x_s24);
  const __m128i x_s32 = _mm_unpacklo_epi32(x_s21, x_s25);
  const __m128i x_s33 = _mm_unpackhi_epi32(x_s21, x_s25);
  const __m128i x_s34 = _mm_unpacklo_epi32(x_s22, x_s26);
  const __m128i x_s35 = _mm_unpackhi_epi32(x_s22, x_s26);
  const __m128i x_s36 = _mm_unpacklo_epi32(x_s23, x_s27);
  const __m128i x_s37 = _mm_unpackhi_epi32(x_s23, x_s27);

  mm_storelu(dst, x_s30);
  mm_storehu(dst + (1 * out_p), x_s30);
  mm_storelu(dst + (2 * out_p), x_s31);
  mm_storehu(dst + (3 * out_p), x_s31);
  mm_storelu(dst + (4 * out_p), x_s32);
  mm_storehu(dst + (5 * out_p), x_s32);
  mm_storelu(dst + (6 * out_p), x_s33);
  mm_storehu(dst + (7 * out_p), x_s33);
  mm_storelu(dst + (8 * out_p), x_s34);
  mm_storehu(dst + (9 * out_p), x_s34);
  mm_storelu(dst + (10 * out_p), x_s35);
  mm_storehu(dst + (11 * out_p), x_s35);
  mm_storelu(dst + (12 * out_p), x_s36);
  mm_storehu(dst + (13 * out_p), x_s36);
  mm_storelu(dst + (14 * out_p), x_s37);
  mm_storehu(dst + (15 * out_p), x_s37);
}